

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O1

void rw::ps2::sendVIF(uint32 w)

{
  (*(code *)(&DAT_001389d0 + *(int *)(&DAT_001389d0 + (ulong)sendVIF::state * 4)))();
  return;
}

Assistant:

static void
sendVIF(uint32 w)
{
	enum VIFstate {
		VST_cmd,
		VST_stmask,
		VST_strow,
		VST_stcol,
		VST_mpg,
		VST_direct,
		VST_unpack
	};
//	static uint32 buf[256 * 16];	// maximum unpack size
	static VIFstate state = VST_cmd;
	static uint32 n;
	static uint32 code;
	uint32 imm, num;

	imm = w & 0xFFFF;
	num = (w>>16) & 0xFF;
	switch(state){
	case VST_cmd:
		code = w;
		if((code & 0x60000000) == VIF_UNPACK){
			printf("\t%08X VIF_UNPACK\n", code);
			printf("\t...skipping...\n");
			state = VST_unpack;
			n = (unpackSize(code)*num + 3) >> 2;
		}else switch(code & 0x7F000000){
		case VIF_NOP:
			printf("\t%08X VIF_NOP\n", code);
			break;
		case VIF_STCYCL:
			printf("\t%08X VIF_STCYCL\n", code);
			break;
		case VIF_OFFSET:
			printf("\t%08X VIF_OFFSET\n", code);
			break;
		case VIF_BASE:
			printf("\t%08X VIF_BASE\n", code);
			break;
		case VIF_ITOP:
			printf("\t%08X VIF_ITOP\n", code);
			break;
		case VIF_STMOD:
			printf("\t%08X VIF_STMOD\n", code);
			break;
		case VIF_MSKPATH3:
			printf("\t%08X VIF_MSKPATH3\n", code);
			break;
		case VIF_MARK:
			printf("\t%08X VIF_MARK\n", code);
			break;
		case VIF_FLUSHE:
			printf("\t%08X VIF_FLUSHE\n", code);
			break;
		case VIF_FLUSH:
			printf("\t%08X VIF_FLUSH\n", code);
			break;
		case VIF_FLUSHA:
			printf("\t%08X VIF_FLUSHA\n", code);
			break;
		case VIF_MSCAL:
			printf("\t%08X VIF_MSCAL\n", code);
			break;
		case VIF_MSCALF:
			printf("\t%08X VIF_MSCALF\n", code);
			break;
		case VIF_MSCNT:
			printf("\t%08X VIF_MSCNT\n", code);
			break;
		case VIF_STMASK:
			printf("\t%08X VIF_STMASK\n", code);
			printf("\t...skipping...\n");
			state = VST_stmask;
			n = 1;
			break;
		case VIF_STROW:
			printf("\t%08X VIF_STROW\n", code);
			printf("\t...skipping...\n");
			state = VST_strow;
			n = 4;
			break;
		case VIF_STCOL:
			printf("\t%08X VIF_STCOL\n", code);
			printf("\t...skipping...\n");
			state = VST_stcol;
			n = 4;
			break;
		case VIF_MPG:
			printf("\t%08X VIF_MPG\n", code);
			state = VST_mpg;
			n = num*2;
			break;
		case VIF_DIRECT:
			printf("\t%08X VIF_DIRECT\n", code);
			printf("\t...skipping...\n");
			state = VST_direct;
			n = imm*4;
			break;
		case VIF_DIRECTHL:
			printf("\t%08X VIF_DIRECTHL\n", code);
			printf("\t...skipping...\n");
			state = VST_direct;
			n = imm*4;
			break;
		default:
			printf("\tUnknown VIFcode %08X\n", code);
		}
		break;
	/* TODO: actually do something here */
	case VST_stmask:
		n--;
		break;
	case VST_strow:
		n--;
		break;
	case VST_stcol:
		n--;
		break;
	case VST_mpg:
		n--;
		break;
	case VST_direct:
		n--;
		break;
	case VST_unpack:
		n--;
		break;
	}
	if(n == 0)
		state = VST_cmd;
}